

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall Fl_Text_Buffer::insert_(Fl_Text_Buffer *this,int pos,char *text)

{
  size_t sVar1;
  int nInserted;
  
  nInserted = 0;
  if ((text != (char *)0x0) && (*text != '\0')) {
    sVar1 = strlen(text);
    nInserted = (int)sVar1;
    if (this->mGapEnd - this->mGapStart < nInserted) {
      reallocate_with_gap(this,pos,this->mPreferredGapSize + nInserted);
    }
    else if (this->mGapStart != pos) {
      move_gap(this,pos);
    }
    memcpy(this->mBuf + pos,text,(long)nInserted);
    this->mGapStart = this->mGapStart + nInserted;
    this->mLength = this->mLength + nInserted;
    update_selections(this,pos,0,nInserted);
    if (this->mCanUndo != '\0') {
      if ((undowidget == this) && (undoinsert != 0 && undoat == pos)) {
        undoinsert = undoinsert + nInserted;
      }
      else {
        undoyankcut = 0;
        undoinsert = nInserted;
        if (undoat == pos) {
          undoyankcut = undocut;
        }
      }
      undoat = pos + nInserted;
      undocut = 0;
      undowidget = this;
    }
  }
  return nInserted;
}

Assistant:

int Fl_Text_Buffer::insert_(int pos, const char *text)
{
  if (!text || !*text)
    return 0;
  
  int insertedLength = (int) strlen(text);
  
  /* Prepare the buffer to receive the new text.  If the new text fits in
   the current buffer, just move the gap (if necessary) to where
   the text should be inserted.  If the new text is too large, reallocate
   the buffer with a gap large enough to accomodate the new text and a
   gap of mPreferredGapSize */
  if (insertedLength > mGapEnd - mGapStart)
    reallocate_with_gap(pos, insertedLength + mPreferredGapSize);
  else if (pos != mGapStart)
    move_gap(pos);
  
  /* Insert the new text (pos now corresponds to the start of the gap) */
  memcpy(&mBuf[pos], text, insertedLength);
  mGapStart += insertedLength;
  mLength += insertedLength;
  update_selections(pos, 0, insertedLength);
  
  if (mCanUndo) {
    if (undowidget == this && undoat == pos && undoinsert) {
      undoinsert += insertedLength;
    } else {
      undoinsert = insertedLength;
      undoyankcut = (undoat == pos) ? undocut : 0;
    }
    undoat = pos + insertedLength;
    undocut = 0;
    undowidget = this;
  }
  
  return insertedLength;
}